

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse::
LocallyRedirectedRpcResponse(LocallyRedirectedRpcResponse *this,Maybe<capnp::MessageSize> *sizeHint)

{
  uint firstSegmentWords;
  
  (this->super_Refcounted).refcount = 0;
  (this->super_RpcResponse).super_ResponseHook._vptr_ResponseHook =
       (_func_int **)&PTR__LocallyRedirectedRpcResponse_006cf740;
  (this->super_RpcServerResponse)._vptr_RpcServerResponse = (_func_int **)&DAT_006cf778;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006cf790;
  firstSegmentWords = 0x400;
  if ((sizeHint->ptr).isSet == true) {
    firstSegmentWords = *(uint *)&(sizeHint->ptr).field_1;
  }
  MallocMessageBuilder::MallocMessageBuilder(&this->message,firstSegmentWords,GROW_HEURISTICALLY);
  return;
}

Assistant:

LocallyRedirectedRpcResponse(kj::Maybe<MessageSize> sizeHint)
        : message(sizeHint.map([](MessageSize size) { return size.wordCount; })
                          .orDefault(SUGGESTED_FIRST_SEGMENT_WORDS)) {}